

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void update_tied_regs(gen_ctx_t gen_ctx,MIR_reg_t reg)

{
  bitmap_t bm;
  char *pcVar1;
  long *nb;
  bitmap_t pVVar2;
  
  if (reg < 0x22) {
    __assert_fail("reg > ST1_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x5f3,"void update_tied_regs(gen_ctx_t, MIR_reg_t)");
  }
  if ((reg != 0xffffffff) &&
     (pcVar1 = MIR_reg_hard_reg_name(gen_ctx->ctx,reg - 0x21,(gen_ctx->curr_func_item->u).func),
     pcVar1 != (char *)0x0)) {
    bm = gen_ctx->tied_regs;
    nb = (long *)((ulong)reg + 1);
    pVVar2 = bm;
    bitmap_expand(bm,(size_t)nb);
    if (bm == (bitmap_t)0x0) {
      update_tied_regs_cold_1();
      if ((*(int *)(pVVar2->els_num + 0x18) == 0xb4) && (*(int *)(*nb + 0x18) == 0xb4)) {
        return;
      }
      __assert_fail("lab1->code == MIR_LABEL && lab2->code == MIR_LABEL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x60c,"int label_cmp(const void *, const void *)");
    }
    bm->varr[reg >> 6] = bm->varr[reg >> 6] | 1L << ((ulong)reg & 0x3f);
  }
  return;
}

Assistant:

static void update_tied_regs (gen_ctx_t gen_ctx, MIR_reg_t reg) {
  gen_assert (reg > MAX_HARD_REG);
  if (reg == MIR_NON_VAR
      || MIR_reg_hard_reg_name (gen_ctx->ctx, reg - MAX_HARD_REG, curr_func_item->u.func) == NULL)
    return;
  bitmap_set_bit_p (tied_regs, reg);
}